

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::RowSingletonPS(RowSingletonPS *this,RowSingletonPS *old)

{
  long in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff60;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffff60,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__RowSingletonPS_0089d1f0;
  (in_RDI->data)._M_elems[10] = *(uint *)(in_RSI + 0x28);
  (in_RDI->data)._M_elems[0xb] = *(uint *)(in_RSI + 0x2c);
  (in_RDI->data)._M_elems[0xc] = *(uint *)(in_RSI + 0x30);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  *(byte *)(in_RDI[2].data._M_elems + 0xd) = *(byte *)(in_RSI + 0xd4) & 1;
  *(byte *)((long)in_RDI[2].data._M_elems + 0x35) = *(byte *)(in_RSI + 0xd5) & 1;
  *(byte *)((long)in_RDI[2].data._M_elems + 0x36) = *(byte *)(in_RSI + 0xd6) & 1;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffff60,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff60,in_RDI);
  return;
}

Assistant:

RowSingletonPS(const RowSingletonPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_j(old.m_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_maxSense(old.m_maxSense)
         , m_obj(old.m_obj)
         , m_col(old.m_col)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_row_obj(old.m_row_obj)
      {}